

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoder.c
# Opt level: O3

int av1_get_preview_raw_frame(AV1_COMP *cpi,YV12_BUFFER_CONFIG *dest)

{
  RefCntBuffer *pRVar1;
  byte bVar2;
  int iVar3;
  
  iVar3 = -1;
  if ((((cpi->common).show_frame != 0) &&
      (pRVar1 = (cpi->common).cur_frame, pRVar1 != (RefCntBuffer *)0x0)) &&
     ((cpi->oxcf).algo_cfg.skip_postproc_filtering == false)) {
    memcpy(dest,&pRVar1->buf,0xd0);
    (dest->field_0).field_0.y_width = (cpi->common).width;
    (dest->field_1).field_0.y_height = (cpi->common).height;
    (dest->field_0).field_0.uv_width =
         (cpi->common).width >> ((byte)((cpi->common).seq_params)->subsampling_x & 0x1f);
    bVar2 = (byte)((cpi->common).seq_params)->subsampling_y & 0x1f;
    (dest->field_1).field_0.uv_height = (cpi->common).height >> bVar2;
    iVar3 = 0 >> bVar2;
  }
  return iVar3;
}

Assistant:

int av1_get_preview_raw_frame(AV1_COMP *cpi, YV12_BUFFER_CONFIG *dest) {
  AV1_COMMON *cm = &cpi->common;
  if (!cm->show_frame) {
    return -1;
  } else {
    int ret;
    if (cm->cur_frame != NULL && !cpi->oxcf.algo_cfg.skip_postproc_filtering) {
      *dest = cm->cur_frame->buf;
      dest->y_width = cm->width;
      dest->y_height = cm->height;
      dest->uv_width = cm->width >> cm->seq_params->subsampling_x;
      dest->uv_height = cm->height >> cm->seq_params->subsampling_y;
      ret = 0;
    } else {
      ret = -1;
    }
    return ret;
  }
}